

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QTextOdfWriter::writeBlockFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextBlockFormat format,int formatIndex)

{
  char16_t *pcVar1;
  ulong uVar2;
  qreal qVar3;
  qreal pixels;
  QBrushData *pQVar4;
  DataPtr DVar5;
  DataPtr DVar6;
  ulong uVar7;
  QBrush QVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  bool bVar12;
  int iVar13;
  Alignment AVar14;
  uint uVar15;
  PageBreakFlags PVar16;
  storage_type *psVar17;
  iterator iVar18;
  QDebug *pQVar19;
  QSharedDataPointer<QTextFormatPrivate> this_00;
  char *pcVar20;
  QStringBuilder<QString,_QString> *this_01;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar22;
  long in_FS_OFFSET;
  undefined4 uVar23;
  undefined4 uVar24;
  QByteArrayView QVar25;
  QAnyStringView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QAnyStringView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QAnyStringView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QAnyStringView QVar43;
  QByteArrayView QVar44;
  QAnyStringView QVar45;
  QByteArrayView QVar46;
  QAnyStringView QVar47;
  QByteArrayView QVar48;
  QAnyStringView QVar49;
  QByteArrayView QVar50;
  QAnyStringView QVar51;
  QByteArrayView QVar52;
  QAnyStringView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QAnyStringView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QAnyStringView QVar59;
  QByteArrayView QVar60;
  QAnyStringView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QAnyStringView QVar64;
  QByteArrayView QVar65;
  QAnyStringView QVar66;
  QByteArrayView QVar67;
  QAnyStringView QVar68;
  QByteArrayView QVar69;
  QAnyStringView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QAnyStringView QVar73;
  QByteArrayView QVar74;
  QAnyStringView QVar75;
  QAnyStringView QVar76;
  QAnyStringView QVar77;
  QAnyStringView QVar78;
  QAnyStringView QVar79;
  QAnyStringView QVar80;
  QAnyStringView QVar81;
  QAnyStringView QVar82;
  QAnyStringView QVar83;
  QAnyStringView QVar84;
  QAnyStringView QVar85;
  QAnyStringView QVar86;
  QAnyStringView QVar87;
  QAnyStringView QVar88;
  QAnyStringView QVar89;
  QAnyStringView QVar90;
  QAnyStringView QVar91;
  QAnyStringView QVar92;
  QAnyStringView QVar93;
  QAnyStringView QVar94;
  QAnyStringView QVar95;
  QAnyStringView QVar96;
  QAnyStringView QVar97;
  QAnyStringView QVar98;
  QAnyStringView QVar99;
  QAnyStringView QVar100;
  QAnyStringView QVar101;
  QAnyStringView QVar102;
  QAnyStringView QVar103;
  QAnyStringView QVar104;
  QAnyStringView QVar105;
  QAnyStringView QVar106;
  QAnyStringView QVar107;
  QAnyStringView QVar108;
  QAnyStringView QVar109;
  QAnyStringView QVar110;
  QAnyStringView QVar111;
  size_t sStack_250;
  QChar *local_228;
  QDebug local_138;
  undefined1 local_130 [8];
  char16_t *local_128;
  ulong uStack_120;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_100;
  QStringBuilder<QString,_QString> local_e8;
  QArrayDataPointer<char16_t> local_b8;
  char16_t *local_98;
  ulong uStack_90;
  QBrush brush;
  char16_t *pcStack_80;
  ulong local_78;
  QArrayDataPointer<char16_t> local_68;
  char16_t *local_48;
  ulong uStack_40;
  long local_38;
  size_t sVar21;
  
  this_00 = format.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("style",6);
  QVar25.m_data = psVar17;
  QVar25.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar25);
  QVar76.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
  QVar76.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
  QVar26.m_size = (size_t)pcVar1;
  QVar26.field_0.m_data_utf8 = (char *)writer;
  QVar76.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar26,QVar76);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
  QVar27.m_data = psVar17;
  QVar27.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar27);
  QVar77.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
  QVar77.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
  uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("p%1",4);
  QVar28.m_data = psVar17;
  QVar28.m_size = (qsizetype)&brush;
  QString::fromLatin1(QVar28);
  sVar21 = 0x20;
  QString::arg<int,_true>
            ((QString *)&local_68,(QString *)&brush,format.super_QTextFormat.format_type,0,10,
             (QChar)0x20);
  local_48 = local_68.ptr;
  uStack_40 = local_68.size | 0x8000000000000000;
  QVar29.m_size = (size_t)pcVar1;
  QVar29.field_0.m_data_utf8 = (char *)writer;
  QVar77.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QVar96.m_size = sVar21;
  QVar96.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar29,QVar77,QVar96);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&brush);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("family",7);
  QVar30.m_data = psVar17;
  QVar30.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar30);
  QVar78.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
  QVar78.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
  uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("paragraph",10);
  QVar31.m_data = psVar17;
  QVar31.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar31);
  local_98 = local_68.ptr;
  uStack_90 = local_68.size | 0x8000000000000000;
  QVar32.m_size = (size_t)pcVar1;
  QVar32.field_0.m_data_utf8 = (char *)writer;
  QVar78.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QVar97.m_size = 0x8000000000000000;
  QVar97.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
  sVar21 = 0x8000000000000000;
  QXmlStreamWriter::writeAttribute(QVar32,QVar78,QVar97);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("paragraph-properties",0x15);
  QVar33.m_data = psVar17;
  QVar33.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar33);
  QVar79.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
  QVar79.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
  QVar34.m_size = (size_t)pcVar1;
  QVar34.field_0.m_data_utf8 = (char *)writer;
  QVar79.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar34,QVar79);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1049);
  if (!bVar12) goto LAB_005248d9;
  iVar13 = QTextBlockFormat::lineHeightType((QTextBlockFormat *)this_00.d.ptr);
  qVar3 = QTextBlockFormat::lineHeight((QTextBlockFormat *)this_00.d.ptr);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       (DataPtr)(__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)0x0;
  pcStack_80 = (char16_t *)0x0;
  local_78 = 0;
  switch(iVar13) {
  case 0:
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("line-height",0xc);
    QVar35.m_data = psVar17;
    QVar35.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar35);
    pQVar4 = (QBrushData *)CONCAT44(local_e8.a.d.d._4_4_,local_e8.a.d.d._0_4_);
    pcVar1 = (char16_t *)CONCAT44(local_e8.a.d.ptr._4_4_,local_e8.a.d.ptr._0_4_);
    local_e8.a.d.d._0_4_ = SUB84(local_68.d,0);
    local_e8.a.d.d._4_4_ = (undefined4)((ulong)local_68.d >> 0x20);
    local_e8.a.d.ptr._0_4_ = SUB84(local_68.ptr,0);
    local_e8.a.d.ptr._4_4_ = (undefined4)((ulong)local_68.ptr >> 0x20);
    uVar2 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    local_e8.a.d.size._0_4_ = (undefined4)local_68.size;
    local_e8.a.d.size._4_4_ = (undefined4)((ulong)local_68.size >> 0x20);
    local_68.d = (Data *)pQVar4;
    local_68.ptr = pcVar1;
    local_68.size = uVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("100%",5);
    this_01 = &local_e8;
    QVar36.m_data = psVar17;
    QVar36.m_size = (qsizetype)this_01;
    QString::fromLatin1(QVar36);
    DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._4_4_ = local_e8.a.d.d._4_4_;
    DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._0_4_ = local_e8.a.d.d._0_4_;
    pcStack_80 = (char16_t *)CONCAT44(local_e8.a.d.ptr._4_4_,local_e8.a.d.ptr._0_4_);
    local_e8.a.d.d._0_4_ =
         brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._0_4_;
    local_e8.a.d.d._4_4_ =
         brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._4_4_;
    local_e8.a.d.ptr._0_4_ = 0;
    local_e8.a.d.ptr._4_4_ = 0;
    local_78 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    local_e8.a.d.size._0_4_ = 0;
    local_e8.a.d.size._4_4_ = 0;
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
         (DataPtr)(DataPtr)DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                           _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    goto LAB_00524852;
  case 1:
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("line-height",0xc);
    QVar38.m_data = psVar17;
    QVar38.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar38);
    pQVar4 = (QBrushData *)CONCAT44(local_e8.a.d.d._4_4_,local_e8.a.d.d._0_4_);
    pcVar1 = (char16_t *)CONCAT44(local_e8.a.d.ptr._4_4_,local_e8.a.d.ptr._0_4_);
    local_e8.a.d.d._0_4_ = SUB84(local_68.d,0);
    local_e8.a.d.d._4_4_ = (undefined4)((ulong)local_68.d >> 0x20);
    local_e8.a.d.ptr._0_4_ = SUB84(local_68.ptr,0);
    local_e8.a.d.ptr._4_4_ = (undefined4)((ulong)local_68.ptr >> 0x20);
    uVar2 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    local_e8.a.d.size._0_4_ = (undefined4)local_68.size;
    local_e8.a.d.size._4_4_ = (undefined4)((ulong)local_68.size >> 0x20);
    local_68.d = (Data *)pQVar4;
    local_68.ptr = pcVar1;
    local_68.size = uVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    this_01 = (QStringBuilder<QString,_QString> *)&local_100;
    QString::number(qVar3,'\0',0x67);
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("%",2);
    QVar39.m_data = psVar17;
    QVar39.m_size = (qsizetype)&local_118;
    QString::fromLatin1(QVar39);
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_e8,(QString *)this_01,(QString *)&local_118);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_b8,&local_e8);
    QVar8 = brush;
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)local_b8.d;
    pcStack_80 = local_b8.ptr;
    local_b8.d = (Data *)QVar8.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                         _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    local_b8.ptr = (char16_t *)0x0;
    local_78 = local_b8.size;
    local_b8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    goto LAB_00524852;
  case 2:
    pcVar20 = "line-height";
    sStack_250 = 0xc;
    break;
  case 3:
    pcVar20 = "line-height-at-least";
    sStack_250 = 0x15;
    break;
  case 4:
    pcVar20 = "line-spacing";
    sStack_250 = 0xd;
    break;
  default:
    goto switchD_00524594_default;
  }
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar20,sStack_250);
  QVar37.m_data = psVar17;
  QVar37.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar37);
  pQVar4 = (QBrushData *)CONCAT44(local_e8.a.d.d._4_4_,local_e8.a.d.d._0_4_);
  pcVar1 = (char16_t *)CONCAT44(local_e8.a.d.ptr._4_4_,local_e8.a.d.ptr._0_4_);
  local_e8.a.d.d._0_4_ = SUB84(local_68.d,0);
  local_e8.a.d.d._4_4_ = (undefined4)((ulong)local_68.d >> 0x20);
  local_e8.a.d.ptr._0_4_ = SUB84(local_68.ptr,0);
  local_e8.a.d.ptr._4_4_ = (undefined4)((ulong)local_68.ptr >> 0x20);
  uVar2 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
  local_e8.a.d.size._0_4_ = (undefined4)local_68.size;
  local_e8.a.d.size._4_4_ = (undefined4)((ulong)local_68.size >> 0x20);
  local_68.d = (Data *)pQVar4;
  local_68.ptr = pcVar1;
  local_68.size = uVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  uVar23 = SUB84(qVar3,0);
  uVar24 = (int)((ulong)qVar3 >> 0x20);
  if (qVar3 <= 0.0) {
    uVar23 = 0;
    uVar24 = 0;
  }
  this_01 = &local_e8;
  pixelToPoint(&this_01->a,(qreal)CONCAT44(uVar24,uVar23));
  DVar6._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._4_4_ = local_e8.a.d.d._4_4_;
  DVar6._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._0_4_ = local_e8.a.d.d._0_4_;
  pcStack_80 = (char16_t *)CONCAT44(local_e8.a.d.ptr._4_4_,local_e8.a.d.ptr._0_4_);
  local_e8.a.d.d._0_4_ =
       brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._0_4_;
  local_e8.a.d.d._4_4_ =
       brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._4_4_;
  local_e8.a.d.ptr._0_4_ = 0;
  local_e8.a.d.ptr._4_4_ = 0;
  local_78 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
  local_e8.a.d.size._0_4_ = 0;
  local_e8.a.d.size._4_4_ = 0;
  brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       (DataPtr)(DataPtr)DVar6._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                         .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
LAB_00524852:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
switchD_00524594_default:
  if (local_68.ptr != (char16_t *)0x0) {
    QVar80.field_0.m_data = (void *)((this->styleNS).d.size | 0x8000000000000000);
    QVar98.field_0.m_data = (void *)(local_68.size | 0x8000000000000000);
    local_128 = pcStack_80;
    uStack_120 = local_78 | 0x8000000000000000;
    QVar40.m_size = (size_t)(this->styleNS).d.ptr;
    QVar40.field_0.m_data_utf8 = (char *)writer;
    QVar80.m_size = (size_t)local_68.ptr;
    QVar98.m_size = sVar21;
    QXmlStreamWriter::writeAttribute(QVar40,QVar80,QVar98);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&brush);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
LAB_005248d9:
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1010);
  if (!bVar12) goto LAB_00524a7c;
  AVar14 = QTextBlockFormat::alignment((QTextBlockFormat *)this_00.d.ptr);
  uVar15 = (uint)AVar14.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1f;
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  switch(uVar15) {
  case 1:
    pcVar20 = "start";
LAB_00524946:
    sStack_250 = 6;
    break;
  case 2:
    pcVar20 = "end";
    sStack_250 = 4;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_00524925_caseD_3:
    local_e8.a.d.d._0_4_ = 2;
    local_e8.a.d.size._4_4_ = 0;
    local_e8.a.d.d._4_4_ = 0;
    local_e8.a.d.ptr._0_4_ = 0;
    local_e8.a.d.ptr._4_4_ = 0;
    local_e8.a.d.size._0_4_ = 0;
    local_e8.b.d.d = (Data *)0x5efe3e;
    QMessageLogger::warning();
    pQVar19 = QDebug::operator<<((QDebug *)&brush,
                                 "QTextOdfWriter: unsupported paragraph alignment; ");
    local_138.stream = pQVar19->stream;
    (local_138.stream)->ref = (local_138.stream)->ref + 1;
    QTextBlockFormat::alignment((QTextBlockFormat *)this_00.d.ptr);
    operator<<<QFlags<Qt::AlignmentFlag>,_true>
              ((Stream *)local_130,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84(&local_138,0));
    QDebug::~QDebug((QDebug *)local_130);
    QDebug::~QDebug(&local_138);
    QDebug::~QDebug((QDebug *)&brush);
    goto LAB_005249cf;
  case 4:
    pcVar20 = "center";
    sStack_250 = 7;
    break;
  case 8:
    pcVar20 = "justify";
    sStack_250 = 8;
    break;
  default:
    if (uVar15 != 0x11) {
      if (uVar15 != 0x12) goto switchD_00524925_caseD_3;
      pcVar20 = "right";
      goto LAB_00524946;
    }
    pcVar20 = "left";
    sStack_250 = 5;
  }
  psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar20,sStack_250);
  QVar41.m_data = psVar17;
  QVar41.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar41);
  pQVar4 = (QBrushData *)CONCAT44(local_e8.a.d.d._4_4_,local_e8.a.d.d._0_4_);
  pcVar1 = (char16_t *)CONCAT44(local_e8.a.d.ptr._4_4_,local_e8.a.d.ptr._0_4_);
  local_e8.a.d.d._0_4_ = SUB84(local_68.d,0);
  local_e8.a.d.d._4_4_ = (undefined4)((ulong)local_68.d >> 0x20);
  local_e8.a.d.ptr._0_4_ = SUB84(local_68.ptr,0);
  local_e8.a.d.ptr._4_4_ = (undefined4)((ulong)local_68.ptr >> 0x20);
  uVar2 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
  local_e8.a.d.size._0_4_ = (undefined4)local_68.size;
  local_e8.a.d.size._4_4_ = (undefined4)((ulong)local_68.size >> 0x20);
  local_68.d = (Data *)pQVar4;
  local_68.ptr = pcVar1;
  local_68.size = uVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
LAB_005249cf:
  if (local_68.ptr != (char16_t *)0x0) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("text-align",0xb);
    QVar42.m_data = psVar17;
    QVar42.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar42);
    QVar81.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar81.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    QVar99.field_0.m_data =
         (void *)(CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size) |
                 0x8000000000000000);
    QVar43.m_size = (size_t)pcVar1;
    QVar43.field_0.m_data_utf8 = (char *)writer;
    QVar81.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar99.m_size = sVar21;
    QXmlStreamWriter::writeAttribute(QVar43,QVar81,QVar99);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
LAB_00524a7c:
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1030);
  if (bVar12) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-top",0xb);
    QVar44.m_data = psVar17;
    QVar44.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar44);
    QVar82.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar82.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    qVar3 = QTextBlockFormat::topMargin((QTextBlockFormat *)this_00.d.ptr);
    uVar23 = SUB84(qVar3,0);
    uVar24 = (int)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar23 = 0;
      uVar24 = 0;
    }
    pixelToPoint((QString *)&local_68,(qreal)CONCAT44(uVar24,uVar23));
    QVar45.m_size = (size_t)pcVar1;
    QVar45.field_0.m_data_utf8 = (char *)writer;
    QVar82.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar100.m_size = sVar21;
    QVar100.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar45,QVar82,QVar100);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1031);
  if (bVar12) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-bottom",0xe);
    QVar46.m_data = psVar17;
    QVar46.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar46);
    QVar83.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar83.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    qVar3 = QTextBlockFormat::bottomMargin((QTextBlockFormat *)this_00.d.ptr);
    uVar23 = SUB84(qVar3,0);
    uVar24 = (int)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar23 = 0;
      uVar24 = 0;
    }
    pixelToPoint((QString *)&local_68,(qreal)CONCAT44(uVar24,uVar23));
    QVar47.m_size = (size_t)pcVar1;
    QVar47.field_0.m_data_utf8 = (char *)writer;
    QVar83.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar101.m_size = sVar21;
    QVar101.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar47,QVar83,QVar101);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1032);
  if ((bVar12) || (bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1040), bVar12))
  {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-left",0xc);
    QVar48.m_data = psVar17;
    QVar48.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar48);
    QVar84.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar84.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    qVar3 = QTextBlockFormat::leftMargin((QTextBlockFormat *)this_00.d.ptr);
    iVar13 = QTextBlockFormat::indent((QTextBlockFormat *)this_00.d.ptr);
    pixels = (double)iVar13 + qVar3;
    if ((double)iVar13 + qVar3 <= 0.0) {
      pixels = 0.0;
    }
    pixelToPoint((QString *)&local_68,pixels);
    QVar49.m_size = (size_t)pcVar1;
    QVar49.field_0.m_data_utf8 = (char *)writer;
    QVar84.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar102.m_size = sVar21;
    QVar102.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar49,QVar84,QVar102);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1033);
  if (bVar12) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-right",0xd);
    QVar50.m_data = psVar17;
    QVar50.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar50);
    QVar85.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar85.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    qVar3 = QTextBlockFormat::rightMargin((QTextBlockFormat *)this_00.d.ptr);
    uVar23 = SUB84(qVar3,0);
    uVar24 = (int)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar23 = 0;
      uVar24 = 0;
    }
    pixelToPoint((QString *)&local_68,(qreal)CONCAT44(uVar24,uVar23));
    QVar51.m_size = (size_t)pcVar1;
    QVar51.field_0.m_data_utf8 = (char *)writer;
    QVar85.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar103.m_size = sVar21;
    QVar103.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar51,QVar85,QVar103);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1034);
  if (bVar12) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("text-indent",0xc);
    QVar52.m_data = psVar17;
    QVar52.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar52);
    QVar86.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar86.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    qVar3 = QTextBlockFormat::textIndent((QTextBlockFormat *)this_00.d.ptr);
    pixelToPoint((QString *)&local_68,qVar3);
    QVar53.m_size = (size_t)pcVar1;
    QVar53.field_0.m_data_utf8 = (char *)writer;
    QVar86.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar104.m_size = sVar21;
    QVar104.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar53,QVar86,QVar104);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x7000);
  if (bVar12) {
    PVar16 = QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)this_00.d.ptr);
    if (((uint)PVar16.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
               super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 1) != 0) {
      pcVar1 = (this->foNS).d.ptr;
      uVar2 = (this->foNS).d.size;
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("break-before",0xd);
      QVar54.m_data = psVar17;
      QVar54.m_size = (qsizetype)&local_e8;
      QString::fromLatin1(QVar54);
      QVar87.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
      QVar87.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
      uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("page",5);
      QVar55.m_data = psVar17;
      QVar55.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar55);
      QVar56.m_size = (size_t)pcVar1;
      QVar56.field_0.m_data_utf8 = (char *)writer;
      QVar87.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
      QVar105.m_size = sVar21;
      QVar105.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar56,QVar87,QVar105);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    }
    PVar16 = QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)this_00.d.ptr);
    if (((uint)PVar16.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
               super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 0x10) != 0) {
      pcVar1 = (this->foNS).d.ptr;
      uVar2 = (this->foNS).d.size;
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("break-after",0xc);
      QVar57.m_data = psVar17;
      QVar57.m_size = (qsizetype)&local_e8;
      QString::fromLatin1(QVar57);
      QVar88.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
      QVar88.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
      uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("page",5);
      QVar58.m_data = psVar17;
      QVar58.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar58);
      QVar59.m_size = (size_t)pcVar1;
      QVar59.field_0.m_data_utf8 = (char *)writer;
      QVar88.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
      QVar106.m_size = sVar21;
      QVar106.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar59,QVar88,QVar106);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    }
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x820);
  if (bVar12) {
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::background((QTextFormat *)&brush);
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
    QVar60.m_data = psVar17;
    QVar60.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar60);
    QVar89.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar89.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    QColor::name((QString *)&local_68,
                 (QColor *)
                 ((long)brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                        _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8),HexRgb);
    QVar61.m_size = (size_t)pcVar1;
    QVar61.field_0.m_data_utf8 = (char *)writer;
    QVar89.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar107.m_size = sVar21;
    QVar107.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar61,QVar89,QVar107);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    QBrush::~QBrush(&brush);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1050);
  if (bVar12) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("keep-together",0xe);
    QVar62.m_data = psVar17;
    QVar62.m_size = (qsizetype)&local_e8;
    QString::fromLatin1(QVar62);
    QVar90.m_size._4_4_ = local_e8.a.d.ptr._4_4_;
    QVar90.m_size._0_4_ = local_e8.a.d.ptr._0_4_;
    uVar7 = CONCAT44(local_e8.a.d.size._4_4_,(undefined4)local_e8.a.d.size);
    bVar12 = QTextBlockFormat::nonBreakableLines((QTextBlockFormat *)this_00.d.ptr);
    if (bVar12) {
      pcVar20 = "true";
      sStack_250 = 5;
    }
    else {
      pcVar20 = "false";
      sStack_250 = 6;
    }
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar20,sStack_250);
    QVar63.m_data = psVar17;
    QVar63.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar63);
    QVar64.m_size = (size_t)pcVar1;
    QVar64.field_0.m_data_utf8 = (char *)writer;
    QVar90.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar108.m_size = sVar21;
    QVar108.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar64,QVar90,QVar108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  bVar12 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1035);
  if (bVar12) {
    local_e8.a.d.size._0_4_ = 0xaaaaaaaa;
    local_e8.a.d.size._4_4_ = 0xaaaaaaaa;
    local_e8.a.d.d._0_4_ = 0xaaaaaaaa;
    local_e8.a.d.d._4_4_ = 0xaaaaaaaa;
    local_e8.a.d.ptr._0_4_ = 0xaaaaaaaa;
    local_e8.a.d.ptr._4_4_ = 0xaaaaaaaa;
    QTextBlockFormat::tabPositions
              ((QList<QTextOption::Tab> *)&local_e8,(QTextBlockFormat *)this_00.d.ptr);
    pcVar1 = (this->styleNS).d.ptr;
    uVar2 = (this->styleNS).d.size;
    psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("tab-stops",10);
    QVar65.m_data = psVar17;
    QVar65.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar65);
    QVar66.m_size = (size_t)pcVar1;
    QVar66.field_0.m_data_utf8 = (char *)writer;
    QVar91.m_size = (size_t)local_68.ptr;
    QVar91.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QXmlStreamWriter::writeStartElement(QVar66,QVar91);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    iVar18 = QList<QTextOption::Tab>::begin((QList<QTextOption::Tab> *)&local_e8);
    for (local_228 = &(iVar18.i)->delimiter;
        iVar18 = QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)&local_e8),
        (Tab *)(local_228 + -6) != iVar18.i; local_228 = local_228 + 8) {
      pcVar1 = (this->styleNS).d.ptr;
      uVar2 = (this->styleNS).d.size;
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("tab-stop",9);
      QVar67.m_data = psVar17;
      QVar67.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar67);
      QVar68.m_size = (size_t)pcVar1;
      QVar68.field_0.m_data_utf8 = (char *)writer;
      QVar92.m_size = (size_t)local_68.ptr;
      QVar92.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
      QXmlStreamWriter::writeEmptyElement(QVar68,QVar92);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      pcVar1 = (this->styleNS).d.ptr;
      uVar2 = (this->styleNS).d.size;
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("position",9);
      QVar69.m_data = psVar17;
      QVar69.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar69);
      pcVar10 = local_68.ptr;
      aVar22.m_data = (void *)(local_68.size | 0x8000000000000000);
      pixelToPoint((QString *)&brush,((Tab *)(local_228 + -6))->position);
      QVar70.m_size = (size_t)pcVar1;
      QVar70.field_0.m_data_utf8 = (char *)writer;
      QVar93.m_size = (size_t)pcVar10;
      QVar93.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
      QVar109.m_size = sVar21;
      QVar109.field_0.m_data = aVar22.m_data;
      QXmlStreamWriter::writeAttribute(QVar70,QVar93,QVar109);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&brush);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      local_68.size = 0;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      switch(*(TabType *)(local_228 + -2)) {
      case LeftTab:
        pcVar20 = "left";
        goto LAB_005254eb;
      case RightTab:
        pcVar20 = "right";
        sStack_250 = 6;
        break;
      case CenterTab:
        pcVar20 = "center";
        sStack_250 = 7;
        break;
      case DelimiterTab:
        pcVar20 = "char";
LAB_005254eb:
        sStack_250 = 5;
        break;
      default:
        goto switchD_005254ca_default;
      }
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar20,sStack_250);
      QVar71.m_data = psVar17;
      QVar71.m_size = (qsizetype)&brush;
      QString::fromLatin1(QVar71);
      qVar11 = local_68.size;
      pcVar1 = local_68.ptr;
      pDVar9 = local_68.d;
      local_68.d = (Data *)brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                           _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      local_68.ptr = pcStack_80;
      brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)pDVar9;
      pcStack_80 = pcVar1;
      local_68.size = local_78;
      local_78 = qVar11;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&brush);
switchD_005254ca_default:
      pcVar1 = (this->styleNS).d.ptr;
      uVar2 = (this->styleNS).d.size;
      psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("type",5);
      QVar72.m_data = psVar17;
      QVar72.m_size = (qsizetype)&brush;
      QString::fromLatin1(QVar72);
      QVar110.field_0.m_data = (void *)(local_78 | 0x8000000000000000);
      QVar73.m_size = (size_t)pcVar1;
      QVar73.field_0.m_data_utf8 = (char *)writer;
      QVar94.m_size = (size_t)pcStack_80;
      QVar94.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
      QVar110.m_size = sVar21;
      QXmlStreamWriter::writeAttribute(QVar73,QVar94,QVar110);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&brush);
      if (local_228->ucs != L'\0') {
        pcVar1 = (this->styleNS).d.ptr;
        uVar2 = (this->styleNS).d.size;
        psVar17 = (storage_type *)QByteArrayView::lengthHelperCharArray("char",5);
        QVar74.m_data = psVar17;
        QVar74.m_size = (qsizetype)&brush;
        QString::fromLatin1(QVar74);
        QVar111.field_0.m_data = (void *)(local_78 | 0x8000000000000000);
        QVar75.m_size = (size_t)pcVar1;
        QVar75.field_0.m_data_utf8 = (char *)writer;
        QVar95.m_size = (size_t)pcStack_80;
        QVar95.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
        QVar111.m_size = sVar21;
        QXmlStreamWriter::writeAttribute(QVar75,QVar95,QVar111);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&brush);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    QXmlStreamWriter::writeEndElement();
    QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer
              ((QArrayDataPointer<QTextOption::Tab> *)&local_e8);
  }
  QXmlStreamWriter::writeEndElement();
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeBlockFormat(QXmlStreamWriter &writer, QTextBlockFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("p%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("paragraph"));
    writer.writeStartElement(styleNS, QString::fromLatin1("paragraph-properties"));

    if (format.hasProperty(QTextBlockFormat::LineHeightType)) {
        const int blockLineHeightType = format.lineHeightType();
        const qreal blockLineHeight = format.lineHeight();
        QString type, value;
        switch (blockLineHeightType) {
        case QTextBlockFormat::SingleHeight:
            type = QString::fromLatin1("line-height");
            value = QString::fromLatin1("100%");
            break;
        case QTextBlockFormat::ProportionalHeight:
            type = QString::fromLatin1("line-height");
            value = QString::number(blockLineHeight) + QString::fromLatin1("%");
            break;
        case QTextBlockFormat::FixedHeight:
            type = QString::fromLatin1("line-height");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::MinimumHeight:
            type = QString::fromLatin1("line-height-at-least");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::LineDistanceHeight:
            type = QString::fromLatin1("line-spacing");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
        }

        if (!type.isNull())
            writer.writeAttribute(styleNS, type, value);
    }

    if (format.hasProperty(QTextFormat::BlockAlignment)) {
        const Qt::Alignment alignment = format.alignment() & Qt::AlignHorizontal_Mask;
        QString value;
        if (alignment == Qt::AlignLeading)
            value = QString::fromLatin1("start");
        else if (alignment == Qt::AlignTrailing)
            value = QString::fromLatin1("end");
        else if (alignment == (Qt::AlignLeft | Qt::AlignAbsolute))
            value = QString::fromLatin1("left");
        else if (alignment == (Qt::AlignRight | Qt::AlignAbsolute))
            value = QString::fromLatin1("right");
        else if (alignment == Qt::AlignHCenter)
            value = QString::fromLatin1("center");
        else if (alignment == Qt::AlignJustify)
            value = QString::fromLatin1("justify");
        else
            qWarning() << "QTextOdfWriter: unsupported paragraph alignment; " << format.alignment();
        if (! value.isNull())
            writer.writeAttribute(foNS, QString::fromLatin1("text-align"), value);
    }

    if (format.hasProperty(QTextFormat::BlockTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::BlockBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::BlockLeftMargin) || format.hasProperty(QTextFormat::BlockIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.),
            format.leftMargin() + format.indent())));
    if (format.hasProperty(QTextFormat::BlockRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );
    if (format.hasProperty(QTextFormat::TextIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("text-indent"), pixelToPoint(format.textIndent()));
    if (format.hasProperty(QTextFormat::PageBreakPolicy)) {
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
            writer.writeAttribute(foNS, QString::fromLatin1("break-before"), QString::fromLatin1("page"));
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
            writer.writeAttribute(foNS, QString::fromLatin1("break-after"), QString::fromLatin1("page"));
    }
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush brush = format.background();
        writer.writeAttribute(foNS, QString::fromLatin1("background-color"), brush.color().name());
    }
    if (format.hasProperty(QTextFormat::BlockNonBreakableLines))
        writer.writeAttribute(foNS, QString::fromLatin1("keep-together"),
                format.nonBreakableLines() ? QString::fromLatin1("true") : QString::fromLatin1("false"));
    if (format.hasProperty(QTextFormat::TabPositions)) {
        QList<QTextOption::Tab> tabs = format.tabPositions();
        writer.writeStartElement(styleNS, QString::fromLatin1("tab-stops"));
        QList<QTextOption::Tab>::Iterator iterator = tabs.begin();
        while(iterator != tabs.end()) {
            writer.writeEmptyElement(styleNS, QString::fromLatin1("tab-stop"));
            writer.writeAttribute(styleNS, QString::fromLatin1("position"), pixelToPoint(iterator->position) );
            QString type;
            switch(iterator->type) {
            case QTextOption::DelimiterTab: type = QString::fromLatin1("char"); break;
            case QTextOption::LeftTab: type = QString::fromLatin1("left"); break;
            case QTextOption::RightTab: type = QString::fromLatin1("right"); break;
            case QTextOption::CenterTab: type = QString::fromLatin1("center"); break;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("type"), type);
            if (!iterator->delimiter.isNull())
                writer.writeAttribute(styleNS, QString::fromLatin1("char"), iterator->delimiter);
            ++iterator;
        }

        writer.writeEndElement(); // tab-stops
    }

    writer.writeEndElement(); // paragraph-properties
    writer.writeEndElement(); // style
}